

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

int Tas_ManAnalyze(Tas_Man_t *p,int Level,Gia_Obj_t *pVar,Gia_Obj_t *pFan0,Gia_Obj_t *pFan1)

{
  int iVar1;
  Gia_Obj_t **ppGVar2;
  int iVar3;
  int iVar4;
  
  if ((pVar->field_0x3 & 0x40) == 0) {
    __assert_fail("Tas_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x350,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan0->field_0x3 & 0x40) == 0) {
    __assert_fail("Tas_VarIsAssigned(pFan0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x351,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan1 != (Gia_Obj_t *)0x0) && ((pFan1->field_0x3 & 0x40) == 0)) {
    __assert_fail("pFan1 == NULL || Tas_VarIsAssigned(pFan1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x352,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = (p->pClauses).iTail;
  if ((p->pClauses).iHead != iVar1) {
    __assert_fail("Tas_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x353,
                  "int Tas_ManAnalyze(Tas_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar3 = (p->pClauses).nSize;
  if (iVar1 == iVar3) {
    (p->pClauses).nSize = iVar3 * 2;
    ppGVar2 = (p->pClauses).pData;
    if (ppGVar2 == (Gia_Obj_t **)0x0) {
      ppGVar2 = (Gia_Obj_t **)malloc((long)iVar3 << 4);
    }
    else {
      ppGVar2 = (Gia_Obj_t **)realloc(ppGVar2,(long)iVar3 << 4);
    }
    (p->pClauses).pData = ppGVar2;
  }
  iVar1 = (p->pClauses).iTail;
  iVar3 = iVar1 + 1;
  (p->pClauses).iTail = iVar3;
  (p->pClauses).pData[iVar1] = (Gia_Obj_t *)0x0;
  iVar1 = (p->pClauses).nSize;
  if (iVar3 == iVar1) {
    (p->pClauses).nSize = iVar1 * 2;
    ppGVar2 = (p->pClauses).pData;
    if (ppGVar2 == (Gia_Obj_t **)0x0) {
      ppGVar2 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
    }
    else {
      ppGVar2 = (Gia_Obj_t **)realloc(ppGVar2,(long)iVar1 << 4);
    }
    (p->pClauses).pData = ppGVar2;
  }
  iVar1 = (p->pClauses).iTail;
  iVar3 = iVar1 + 1;
  (p->pClauses).iTail = iVar3;
  (p->pClauses).pData[iVar1] = pVar;
  iVar1 = (p->pClauses).nSize;
  if (iVar3 == iVar1) {
    (p->pClauses).nSize = iVar1 * 2;
    ppGVar2 = (p->pClauses).pData;
    if (ppGVar2 == (Gia_Obj_t **)0x0) {
      ppGVar2 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
    }
    else {
      ppGVar2 = (Gia_Obj_t **)realloc(ppGVar2,(long)iVar1 << 4);
    }
    (p->pClauses).pData = ppGVar2;
  }
  iVar1 = (p->pClauses).iTail;
  iVar3 = iVar1 + 1;
  (p->pClauses).iTail = iVar3;
  (p->pClauses).pData[iVar1] = pFan0;
  if (pFan1 != (Gia_Obj_t *)0x0) {
    iVar1 = (p->pClauses).nSize;
    if (iVar3 == iVar1) {
      (p->pClauses).nSize = iVar1 * 2;
      ppGVar2 = (p->pClauses).pData;
      if (ppGVar2 == (Gia_Obj_t **)0x0) {
        ppGVar2 = (Gia_Obj_t **)malloc((long)iVar1 << 4);
      }
      else {
        ppGVar2 = (Gia_Obj_t **)realloc(ppGVar2,(long)iVar1 << 4);
      }
      (p->pClauses).pData = ppGVar2;
    }
    iVar1 = (p->pClauses).iTail;
    (p->pClauses).iTail = iVar1 + 1;
    (p->pClauses).pData[iVar1] = pFan1;
  }
  Tas_ManDeriveReason(p,Level);
  iVar1 = (p->pClauses).iHead;
  iVar3 = (p->pClauses).iTail;
  if (iVar1 < iVar3) {
    iVar4 = (p->pClauses).nSize;
    if (iVar3 == iVar4) {
      (p->pClauses).nSize = iVar4 * 2;
      ppGVar2 = (p->pClauses).pData;
      if (ppGVar2 == (Gia_Obj_t **)0x0) {
        ppGVar2 = (Gia_Obj_t **)malloc((long)iVar4 << 4);
      }
      else {
        ppGVar2 = (Gia_Obj_t **)realloc(ppGVar2,(long)iVar4 << 4);
      }
      (p->pClauses).pData = ppGVar2;
    }
    iVar3 = (p->pClauses).iTail;
    iVar4 = iVar3 + 1;
    (p->pClauses).iTail = iVar4;
    (p->pClauses).pData[iVar3] = (Gia_Obj_t *)0x0;
    (p->pClauses).iHead = iVar4;
    return iVar1;
  }
  __assert_fail("p->iHead < p->iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                ,0x1a5,"int Tas_QueFinish(Tas_Que_t *)");
}

Assistant:

static inline int Tas_ManAnalyze( Tas_Man_t * p, int Level, Gia_Obj_t * pVar, Gia_Obj_t * pFan0, Gia_Obj_t * pFan1 )
{
    Tas_Que_t * pQue = &(p->pClauses);
    assert( Tas_VarIsAssigned(pVar) );
    assert( Tas_VarIsAssigned(pFan0) );
    assert( pFan1 == NULL || Tas_VarIsAssigned(pFan1) );
    assert( Tas_QueIsEmpty( pQue ) );
    Tas_QuePush( pQue, NULL );
    Tas_QuePush( pQue, pVar );
    Tas_QuePush( pQue, pFan0 );
    if ( pFan1 )
        Tas_QuePush( pQue, pFan1 );
    Tas_ManDeriveReason( p, Level );
    return Tas_QueFinish( pQue );
}